

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O1

void ur_df2(double *y,int N,char *type,int *lags,char *selectlags,double *cval,int *cvrows,
           int *cvcols,double *cprobs,double *teststat,int *ltstat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  double *oup;
  double *y_00;
  ulong uVar7;
  void *__src;
  double *pdVar8;
  void *__ptr;
  double *pdVar9;
  double *pdVar10;
  reg_object prVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  undefined *puVar16;
  uint N_00;
  long lVar17;
  ulong uVar18;
  undefined *puVar19;
  char *__s;
  int iVar20;
  int iVar21;
  int iVar22;
  size_t sVar23;
  long lVar24;
  uint p;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  long local_60;
  reg_object local_58;
  double *local_38;
  ulong uVar25;
  
  if (lags == (int *)0x0) {
    uVar14 = 1;
  }
  else {
    uVar14 = (ulong)(uint)*lags;
  }
  iVar6 = (int)uVar14;
  if (iVar6 < 0) {
    __s = "lags should be > 0. ";
LAB_00148eee:
    puts(__s);
    exit(-1);
  }
  p = iVar6 + 1;
  uVar25 = (ulong)p;
  iVar20 = N + -1;
  iVar21 = iVar20 - p;
  lVar24 = (long)iVar21;
  lVar17 = lVar24 + 1;
  N_00 = iVar21 + 1;
  oup = (double *)malloc((long)N * 8 - 8);
  sVar23 = lVar24 * 8 + 8;
  y_00 = (double *)malloc(sVar23 * uVar25);
  diff(y,N,1,oup);
  uVar7 = 0;
  uVar15 = uVar14;
  pdVar8 = y_00;
  do {
    if (-1 < iVar21) {
      uVar18 = 0;
      do {
        pdVar8[uVar18] = oup[(int)uVar15 + (int)uVar18];
        uVar18 = uVar18 + 1;
      } while (N_00 != uVar18);
    }
    uVar7 = uVar7 + 1;
    pdVar8 = pdVar8 + lVar24 + 1;
    uVar15 = uVar15 - 1;
  } while (uVar7 != uVar25);
  __src = malloc(sVar23);
  pdVar8 = (double *)malloc(sVar23);
  if (iVar6 < iVar20) {
    uVar15 = uVar14;
    do {
      uVar7 = uVar15 + 1;
      *(double *)((long)__src + uVar15 * 8 + (ulong)p * -8 + 8) = (double)(int)uVar7;
      uVar15 = uVar7;
    } while ((long)iVar20 != uVar7);
  }
  pdVar13 = y + uVar14;
  iVar20 = (int)lVar17;
  if (iVar6 == 0) {
    pdVar9 = (double *)malloc(lVar17 * 0x10);
    iVar6 = strcmp(type,"none");
    if (iVar6 == 0) {
      local_38 = (double *)malloc(8);
      local_58 = reg_init(iVar20,1);
      setIntercept(local_58,0);
      memcpy(pdVar9,pdVar13,sVar23);
      regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
      *teststat = local_58->beta[0].value / local_58->beta[0].stdErr;
      *ltstat = 1;
    }
    else {
      iVar6 = strcmp(type,"drift");
      if (iVar6 == 0) {
        local_38 = (double *)malloc(0x20);
        local_58 = reg_init(iVar20,2);
        setIntercept(local_58,1);
        memcpy(pdVar9,pdVar13,sVar23);
        regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
        dVar29 = *(double *)(local_58 + 1);
        dVar1 = local_58[1].sigma_lower;
        dVar2 = local_58->RSS;
        iVar6 = local_58->df_RSS;
        prVar11 = reg_init(iVar20,0);
        regress(prVar11,(double *)0x0,y_00,pdVar8,local_38,0.95);
        dVar3 = prVar11->RSS;
        dVar4 = local_58->RSS;
        iVar20 = prVar11->df_RSS;
        iVar21 = local_58->df_RSS;
        *teststat = dVar29 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar20 - iVar21)) / (dVar2 / (double)iVar6);
        *ltstat = 2;
      }
      else {
        local_38 = (double *)malloc(0x48);
        local_58 = reg_init(iVar20,3);
        setIntercept(local_58,1);
        memcpy(pdVar9,pdVar13,sVar23);
        memcpy(pdVar9 + lVar17,__src,sVar23);
        regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
        dVar29 = *(double *)(local_58 + 1);
        dVar1 = local_58[1].sigma_lower;
        dVar30 = local_58->RSS / (double)local_58->df_RSS;
        prVar11 = reg_init(iVar20,0);
        regress(prVar11,(double *)0x0,y_00,pdVar8,local_38,0.95);
        dVar2 = prVar11->RSS;
        dVar3 = local_58->RSS;
        iVar6 = prVar11->df_RSS;
        iVar21 = local_58->df_RSS;
        free(prVar11);
        prVar11 = reg_init(iVar20,1);
        setIntercept(prVar11,1);
        regress(prVar11,(double *)0x0,y_00,pdVar8,local_38,0.95);
        dVar4 = prVar11->RSS;
        dVar5 = local_58->RSS;
        iVar20 = prVar11->df_RSS;
        iVar22 = local_58->df_RSS;
        *teststat = dVar29 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar6 - iVar21)) / dVar30;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar20 - iVar22)) / dVar30;
        *ltstat = 3;
      }
      free(prVar11);
    }
  }
  else {
    iVar21 = strcmp(selectlags,"fixed");
    if (iVar21 != 0) {
      __ptr = malloc(uVar25 * 8);
      pdVar9 = (double *)malloc((iVar6 + 2) * sVar23);
      uVar15 = 0;
      do {
        *(undefined8 *)((long)__ptr + uVar15 * 8) = 0x7ff8000000000000;
        uVar15 = uVar15 + 1;
      } while (iVar6 + 1 != uVar15);
      uVar15 = 1;
      if (1 < iVar6) {
        uVar15 = uVar14;
      }
      lVar24 = 2;
      local_60 = 0x10;
      local_38 = (double *)((long)(int)N_00 * 8);
      do {
        memcpy(pdVar9,pdVar13,sVar23);
        iVar21 = strcmp(type,"none");
        if (iVar21 == 0) {
          pdVar10 = (double *)malloc(local_60 * lVar24);
          prVar11 = reg_init(N_00,(int)lVar24);
          iVar21 = 0;
LAB_001483d5:
          setIntercept(prVar11,iVar21);
          memcpy(pdVar9 + lVar17,y_00 + lVar17,(size_t)local_38);
        }
        else {
          iVar21 = strcmp(type,"drift");
          if (iVar21 == 0) {
            pdVar10 = (double *)malloc((local_60 + 8) * (lVar24 + 1));
            prVar11 = reg_init(N_00,(int)(lVar24 + 1));
            iVar21 = 1;
            goto LAB_001483d5;
          }
          iVar21 = strcmp(type,"trend");
          if (iVar21 != 0) goto LAB_00148ee7;
          pdVar10 = (double *)malloc((local_60 + 0x10) * (lVar24 + 2));
          prVar11 = reg_init(N_00,(int)(lVar24 + 2));
          setIntercept(prVar11,1);
          memcpy(pdVar9 + lVar17,__src,sVar23);
          memcpy(pdVar9 + (int)(N_00 * 2),y_00 + lVar17,(size_t)local_38);
        }
        regress(prVar11,pdVar9,y_00,pdVar8,pdVar10,0.95);
        iVar21 = strcmp(selectlags,"aic");
        if (iVar21 == 0) {
          lVar12 = 0x98;
LAB_00148452:
          *(undefined8 *)((long)__ptr + lVar24 * 8 + -8) =
               *(undefined8 *)((long)prVar11->R2 + lVar12 + -0x38);
        }
        else {
          iVar21 = strcmp(selectlags,"bic");
          if (iVar21 == 0) {
            lVar12 = 0xa0;
            goto LAB_00148452;
          }
        }
        free_reg(prVar11);
        local_60 = local_60 + 8;
        local_38 = (double *)((long)local_38 + (long)(int)N_00 * 8);
        lVar12 = lVar24 - uVar15;
        lVar24 = lVar24 + 1;
      } while (lVar12 != 1);
      uVar15 = 1;
      if (1 < iVar6) {
        uVar15 = uVar14;
      }
      uVar7 = 0;
      uVar27 = 0xffffffff;
      uVar28 = 0x7fefffff;
      uVar14 = 1;
      do {
        dVar29 = *(double *)((long)__ptr + uVar14 * 8);
        if (dVar29 <= (double)CONCAT44(uVar28,uVar27) && (double)CONCAT44(uVar28,uVar27) != dVar29)
        {
          uVar7 = uVar14 & 0xffffffff;
        }
        if ((double)CONCAT44(uVar28,uVar27) <= dVar29) {
          dVar29 = (double)CONCAT44(uVar28,uVar27);
        }
        uVar27 = SUB84(dVar29,0);
        uVar28 = (undefined4)((ulong)dVar29 >> 0x20);
        bVar26 = uVar14 != uVar15;
        uVar14 = uVar14 + 1;
      } while (bVar26);
      p = (int)uVar7 + 1;
      free(__ptr);
      free(pdVar9);
      free(pdVar10);
    }
    lVar24 = (long)(int)(p + 1);
    pdVar9 = (double *)malloc(sVar23 * lVar24);
    memcpy(pdVar9,pdVar13,sVar23);
    iVar6 = p - 1;
    iVar22 = iVar6 * N_00;
    iVar21 = strcmp(type,"none");
    if (iVar21 == 0) {
      local_38 = (double *)malloc((long)(int)p * (long)(int)p * 8);
      local_58 = reg_init(N_00,p);
      setIntercept(local_58,0);
      memcpy(pdVar9 + lVar17,y_00 + lVar17,(long)iVar22 << 3);
      regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
      *teststat = local_58->beta[0].value / local_58->beta[0].stdErr;
      *ltstat = 1;
    }
    else {
      iVar21 = strcmp(type,"drift");
      if (iVar21 == 0) {
        local_38 = (double *)malloc(lVar24 * lVar24 * 8);
        local_58 = reg_init(N_00,p + 1);
        setIntercept(local_58,1);
        memcpy(pdVar9 + lVar17,y_00 + lVar17,(long)iVar22 << 3);
        regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
        dVar29 = *(double *)(local_58 + 1);
        dVar1 = local_58[1].sigma_lower;
        iVar20 = local_58->df_RSS;
        dVar2 = local_58->RSS;
        pdVar13 = (double *)malloc(sVar23 * (long)iVar6);
        memcpy(pdVar13,y_00 + lVar17,sVar23 * (long)iVar6);
        prVar11 = reg_init(N_00,iVar6);
        setIntercept(prVar11,0);
        regress(prVar11,pdVar13,y_00,pdVar8,local_38,0.95);
        dVar3 = prVar11->RSS;
        dVar4 = local_58->RSS;
        iVar6 = prVar11->df_RSS;
        iVar21 = local_58->df_RSS;
        *teststat = dVar29 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar6 - iVar21)) / (dVar2 / (double)iVar20);
        *ltstat = 2;
      }
      else {
        iVar21 = strcmp(type,"trend");
        if (iVar21 != 0) {
LAB_00148ee7:
          __s = "type only accepts one of three values - none, drift and trend ";
          goto LAB_00148eee;
        }
        iVar21 = p + 2;
        local_38 = (double *)malloc((long)iVar21 * (long)iVar21 * 8);
        local_58 = reg_init(iVar20,iVar21);
        setIntercept(local_58,1);
        memcpy(pdVar9 + lVar17,__src,sVar23);
        pdVar10 = y_00 + lVar17;
        memcpy(pdVar9 + iVar20 * 2,pdVar10,(long)iVar22 << 3);
        regress(local_58,pdVar9,y_00,pdVar8,local_38,0.95);
        dVar29 = *(double *)(local_58 + 1);
        dVar1 = local_58[1].sigma_lower;
        dVar30 = local_58->RSS / (double)local_58->df_RSS;
        sVar23 = sVar23 * (long)iVar6;
        pdVar13 = (double *)malloc(sVar23);
        memcpy(pdVar13,pdVar10,sVar23);
        prVar11 = reg_init(iVar20,iVar6);
        setIntercept(prVar11,0);
        regress(prVar11,pdVar13,y_00,pdVar8,local_38,0.95);
        dVar2 = prVar11->RSS;
        dVar3 = local_58->RSS;
        iVar6 = prVar11->df_RSS;
        iVar21 = local_58->df_RSS;
        free(pdVar13);
        free(prVar11);
        pdVar13 = (double *)malloc(sVar23);
        memcpy(pdVar13,pdVar10,sVar23);
        prVar11 = reg_init(iVar20,p);
        setIntercept(prVar11,1);
        regress(prVar11,pdVar13,y_00,pdVar8,local_38,0.95);
        dVar4 = prVar11->RSS;
        dVar5 = local_58->RSS;
        iVar20 = prVar11->df_RSS;
        iVar22 = local_58->df_RSS;
        *teststat = dVar29 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar6 - iVar21)) / dVar30;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar20 - iVar22)) / dVar30;
        *ltstat = 3;
      }
      free(pdVar13);
      free(prVar11);
    }
  }
  free(pdVar9);
  free(local_38);
  if (N < 0x1a) {
    lVar17 = 0;
  }
  else {
    lVar17 = 3;
    if (((0x32 < N) && (lVar17 = 6, 100 < N)) && (lVar17 = 9, 0xfa < N)) {
      lVar17 = (ulong)(500 < N) * 3 + 0xc;
    }
  }
  iVar6 = strcmp(type,"none");
  if (iVar6 == 0) {
    iVar6 = 1;
    puVar16 = &DAT_00155e00;
  }
  else {
    iVar6 = strcmp(type,"drift");
    if (iVar6 == 0) {
      iVar6 = 2;
      puVar16 = &DAT_00155fb0;
      lVar24 = 0x18;
      puVar19 = &DAT_00155e90;
      pdVar13 = cval;
    }
    else {
      iVar6 = strcmp(type,"trend");
      if (iVar6 != 0) goto LAB_00148e7e;
      cval[2] = (double)(&DAT_00155f30)[lVar17];
      dVar29 = *(double *)(&UNK_00155f28 + lVar17 * 8);
      *cval = *(double *)(&DAT_00155f20 + lVar17 * 8);
      cval[1] = dVar29;
      iVar6 = 3;
      puVar16 = &DAT_001560d0;
      lVar24 = 0x30;
      puVar19 = &DAT_00156040;
      pdVar13 = cval + 3;
    }
    pdVar13[2] = *(double *)(puVar19 + lVar17 * 8 + 0x10);
    dVar29 = *(double *)((long)(puVar19 + lVar17 * 8) + 8);
    *pdVar13 = *(double *)(puVar19 + lVar17 * 8);
    pdVar13[1] = dVar29;
    cval = (double *)((long)cval + lVar24);
  }
  cval[2] = *(double *)(puVar16 + lVar17 * 8 + 0x10);
  dVar29 = *(double *)((long)(puVar16 + lVar17 * 8) + 8);
  *cval = *(double *)(puVar16 + lVar17 * 8);
  cval[1] = dVar29;
  *cvrows = iVar6;
  *cvcols = 3;
LAB_00148e7e:
  *cprobs = 0.01;
  cprobs[1] = 0.05;
  cprobs[2] = 0.1;
  free(y_00);
  free(oup);
  free(__src);
  free(pdVar8);
  free(local_58);
  return;
}

Assistant:

void ur_df2(double *y, int N,const char* type, int *lags,const char *selectlags,double *cval,int *cvrows, int *cvcols, double *cprobs, double *teststat,int *ltstat) {
    int lags_, lag, N1, N2,i,j,iter,p,ltmp,p1,p2,p3,rowselec,row1;
    double *z, *x,*z_diff,*z_lag_1,*tt,*critRes,*z_diff_lag,*XX,*varcovar,*res,*XX2,*XX3;
    reg_object fit, phi1_fit,phi2_fit,phi3_fit;
    double alpha = 0.95;
    double ctemp,tau,scale,sos,dfs,phi1,phi2,phi3;
    double cval_tau1[18] = {-2.66, -1.95, -1.60,-2.62, -1.95, -1.61,-2.60, -1.95, -1.61,-2.58, -1.95, -1.62,
        -2.58, -1.95, -1.62,-2.58, -1.95, -1.62};
    double cval_tau2[18] = {-3.75, -3.00, -2.63,-3.58, -2.93, -2.60,-3.51, -2.89, -2.58,-3.46, -2.88, -2.57,
        -3.44, -2.87, -2.57,-3.43, -2.86, -2.57};
    double cval_tau3[18] = {-4.38, -3.60, -3.24,-4.15, -3.50, -3.18,-4.04, -3.45, -3.15,-3.99, -3.43, -3.13,
        -3.98, -3.42, -3.13,-3.96, -3.41, -3.12};
    double cval_phi1[18] = {7.88, 5.18, 4.12,7.06, 4.86, 3.94,6.70, 4.71, 3.86,6.52, 4.63, 3.81,6.47, 4.61,
         3.79,6.43, 4.59, 3.78};
    double cval_phi2[18] = {8.21, 5.68, 4.67,7.02, 5.13, 4.31,6.50, 4.88, 4.16,6.22, 4.75, 4.07,6.15, 4.71,
         4.05,6.09, 4.68, 4.03};
    double cval_phi3[18] = {10.61, 7.24, 5.91,9.31, 6.73, 5.61,8.73, 6.49, 5.47,8.43, 6.49, 5.47,8.34, 6.30,
         5.36,8.27, 6.25, 5.34};

    lags_ = (lags == NULL) ? 1 : *lags;
    lag = lags_;

    if (lag < 0) {
        printf("lags should be > 0. \n");
        exit(-1);
    }

    lags_+=1;

    N1 = N - 1;
    N2 = N1 - lags_ + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*N2*lags_);
    

    diff(y,N,1,z);// z = y(t) - y(t-1)
    
    for(i = 0; i < lags_;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags_+j-i-1];
        }
    } 


    z_diff = &x[0];//length N2
    z_lag_1 = &y[lags_-1];//length N2


    tt = (double*)malloc(sizeof(double)*N2);
    res = (double*)malloc(sizeof(double)*N2);

    for(i = lags_ - 1; i < N1;++i) {
        tt[i - lags_ +1] = i+1;
    }

    if (lags_ > 1) {
        if (strcmp(selectlags,"fixed")) {
            critRes = (double*) malloc(sizeof(double)*lags_);
            XX = (double*)malloc(sizeof(double)*N2*(lags_+1));
            for(i = 0; i < lags_;++i) {
                critRes[i] = NAN;
            }

            for(i = 1; i < lags_;++i) {
                iter = i * N2;

                memcpy(XX,z_lag_1,sizeof(double)*N2);

                if (!strcmp(type,"none")) {
                    p = 1 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,0);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);
                    
                } else if (!strcmp(type,"drift")) {
                    p = 2 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else if (!strcmp(type,"trend")) {
                    p = 3 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,tt,sizeof(double)*N2);
                    memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else {
                    printf("type only accepts one of three values - none, drift and trend \n");
                    exit(-1);
                }

                if (!strcmp(selectlags,"aic")) {
                    critRes[i] = fit->aic;
                } else if (!strcmp(selectlags,"bic")) {
                    critRes[i] = fit->bic;
                }

                free_reg(fit);
            }

            ctemp = DBL_MAX;
            ltmp = 0;

            for(i = 1; i < lags_;++i) {
                if (critRes[i] < ctemp) {
                    ctemp = critRes[i];
                    ltmp = i;
                }
            }

            lags_ = ltmp+1;


            free(critRes);
            free(XX);
            free(varcovar);
        }

        XX = (double*)malloc(sizeof(double)*N2*(lags_+1));

        memcpy(XX,z_lag_1,sizeof(double)*N2);
        iter = (lags_-1) * N2;

        if (!strcmp(type,"none")) {
            p = lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 1 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p1 = lags_ - 1;
            phi1_fit = reg_init(N2,p1);
            setIntercept(phi1_fit,0);
            regress(phi1_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;


            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(XX2);
            free(phi1_fit);
        } else if (!strcmp(type,"trend")) {
            p = 2 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p2 = lags_ - 1;
            phi2_fit = reg_init(N2,p2);
            setIntercept(phi2_fit,0);
            regress(phi2_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;


            free(XX2);
            free(phi2_fit);

            XX3 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX3,x+N2,sizeof(double)*N2*(lags_-1));
            p3 = lags_;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,XX3,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(XX3);
            free(phi3_fit);
        } else {
            printf("type only accepts one of three values - none, drift and trend \n");
            exit(-1);
        }

        free(XX);
        free(varcovar);

    } else {
        XX = (double*)malloc(sizeof(double)*2*N2);
        if (!strcmp(type,"none")) {
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p1 = 0;
            phi1_fit = reg_init(N2,p1);
            regress(phi1_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(phi1_fit);

        } else if (!strcmp(type,"trend")) {
            p = 3;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p2 = 0;
            phi2_fit = reg_init(N2,p2);
            regress(phi2_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;

            free(phi2_fit);

            p3 = 1;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(phi3_fit);
        }

        free(XX);
        free(varcovar);
    }

    
    if (N1 < 25){
        rowselec = 1;
    } else if (N1 < 50) {
        rowselec = 2;
    } else if (N1 < 100) {
        rowselec = 3;
    } else if (N1 < 250) {
        rowselec = 4;
    } else if (N1 < 500) {
        rowselec = 5;
    } else {
        rowselec = 6;
    }
    row1 = rowselec - 1;

    if (!strcmp(type,"none")) {
        memcpy(cval,cval_tau1+row1*3,sizeof(double)*3);
        *cvrows = 1;
        *cvcols = 3;
    } else if (!strcmp(type,"drift")) {
        memcpy(cval,cval_tau2+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi1+row1*3,sizeof(double)*3);
        *cvrows = 2;
        *cvcols = 3;
    } else if (!strcmp(type,"trend")) {
        memcpy(cval,cval_tau3+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi2+row1*3,sizeof(double)*3);
        memcpy(cval+6,cval_phi3+row1*3,sizeof(double)*3);
        *cvrows = 3;
        *cvcols = 3;
    }


    cprobs[0] = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;

    free(x);
    free(z);
    free(tt);
    free(res);
    free(fit);
}